

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

GLint __thiscall
gl4cts::ShaderSubroutine::Utils::program::getSubroutineUniformLocation
          (program *this,GLchar *uniform_name,GLenum shader_stage)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  TestError *this_02;
  GLchar *local_1a0;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1a0 = uniform_name;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa90))
                    (this->m_program_object_id,shader_stage,local_1a0);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"GetSubroutineUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1d9);
  if (iVar2 != -1) {
    return iVar2;
  }
  local_198._0_8_ = this->m_context->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Subroutine uniform: ",0x14)
  ;
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
             " is not available",0x11);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Subroutine uniform is not available",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x1e0);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GLint Utils::program::getSubroutineUniformLocation(const glw::GLchar* uniform_name, glw::GLenum shader_stage) const
{
	const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
	GLint				  location = -1;

	location = gl.getSubroutineUniformLocation(m_program_object_id, shader_stage, uniform_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetSubroutineUniformLocation");

	if (-1 == location)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Subroutine uniform: " << uniform_name
											<< " is not available" << tcu::TestLog::EndMessage;

		TCU_FAIL("Subroutine uniform is not available");
	}

	return location;
}